

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

string * __thiscall
glcts::(anonymous_namespace)::UniformBlockTypes::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 310 es                \nstruct U {                     \n   bool a[3];                  \n   mediump vec4 b;                     \n   mediump mat3 c;                     \n   mediump float d[2];                 \n};                             \nstruct UU {                    \n   U a;                        \n   U b[2];                     \n   uvec2 c;                    \n};                             \nuniform TrickyBlock {                            \n   UU a[3];                                      \n   mediump mat4 b;                               \n   uint c;                                       \n} e[2];                                          \nout mediump vec4 color;                        \nvoid main() {                                  \n    mediump float tmp;                         \n    tmp = e[0].a[2].b[0].d[1] * float(e[1].c); \n    color = vec4(0, 1, 0, 1) * tmp;            \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                \n"
			   "struct U {                     \n"
			   "   bool a[3];                  \n"
			   "   mediump vec4 b;                     \n"
			   "   mediump mat3 c;                     \n"
			   "   mediump float d[2];                 \n"
			   "};                             \n"
			   "struct UU {                    \n"
			   "   U a;                        \n"
			   "   U b[2];                     \n"
			   "   uvec2 c;                    \n"
			   "};                             \n"
			   ""
			   "uniform TrickyBlock {                            \n"
			   "   UU a[3];                                      \n"
			   "   mediump mat4 b;                               \n"
			   "   uint c;                                       \n"
			   "} e[2];                                          \n"
			   ""
			   "out mediump vec4 color;                        \n"
			   "void main() {                                  \n"
			   "    mediump float tmp;                         \n"
			   "    tmp = e[0].a[2].b[0].d[1] * float(e[1].c); \n"
			   "    color = vec4(0, 1, 0, 1) * tmp;            \n"
			   "}";
	}